

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_chain_accept(llama_sampler *smpl,llama_token token)

{
  llama_sampler_context_t pvVar1;
  undefined8 *puVar2;
  code *pcVar3;
  undefined8 *puVar4;
  time_meas tm;
  time_meas local_30;
  
  pvVar1 = smpl->ctx;
  time_meas::time_meas(&local_30,(int64_t *)((long)pvVar1 + 0x20),*pvVar1);
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  for (puVar4 = *(undefined8 **)((long)pvVar1 + 8); puVar4 != puVar2; puVar4 = puVar4 + 1) {
    pcVar3 = *(code **)(*(long *)*puVar4 + 8);
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)((long *)*puVar4,token);
    }
  }
  *(int *)((long)pvVar1 + 0x28) = *(int *)((long)pvVar1 + 0x28) + 1;
  time_meas::~time_meas(&local_30);
  return;
}

Assistant:

static void llama_sampler_chain_accept(struct llama_sampler * smpl, llama_token token) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    time_meas tm(chain->t_sample_us, chain->params.no_perf);

    for (auto * smpl : chain->samplers) {
        llama_sampler_accept(smpl, token);
    }

    chain->n_sample++;
}